

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O1

void * utf8dup(void *src)

{
  long lVar1;
  size_t __size;
  void *pvVar2;
  long lVar3;
  char cVar4;
  
  __size = utf8size(src);
  pvVar2 = malloc(__size);
  if (pvVar2 == (void *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    lVar3 = 0;
    cVar4 = *src;
    while (cVar4 != '\0') {
      *(char *)((long)pvVar2 + lVar3) = cVar4;
      lVar1 = lVar3 + 1;
      lVar3 = lVar3 + 1;
      cVar4 = *(char *)((long)src + lVar1);
    }
    *(undefined1 *)((long)pvVar2 + lVar3) = 0;
  }
  return pvVar2;
}

Assistant:

void *utf8dup(const void *src) {
  const char *s = (const char *)src;
  char *n = 0;

  // figure out how many bytes (including the terminator) we need to copy first
  size_t bytes = utf8size(src);

  n = (char *)malloc(bytes);

  if (0 == n) {
    // out of memory so we bail
    return 0;
  } else {
    bytes = 0;

    // copy src byte-by-byte into our new utf8 string
    while ('\0' != s[bytes]) {
      n[bytes] = s[bytes];
      bytes++;
    }

    // append null terminating byte
    n[bytes] = '\0';
    return n;
  }
}